

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

void test_bson_iter_binary_deprecated(void)

{
  char cVar1;
  bson_t *pbVar2;
  undefined8 uVar3;
  char *pcVar4;
  uint8_t *binary;
  uint32_t binary_len;
  bson_subtype_t subtype;
  bson_iter_t iter;
  int *local_110;
  int local_108;
  undefined1 local_104 [4];
  undefined1 local_100 [232];
  
  pbVar2 = get_bson(
                   "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/binary_deprecated.bson"
                   );
  if (pbVar2 == (bson_t *)0x0) {
    pcVar4 = "b";
    uVar3 = 0xa5;
  }
  else {
    cVar1 = bson_iter_init(local_100,pbVar2);
    if (cVar1 == '\0') {
      pcVar4 = "bson_iter_init (&iter, b)";
      uVar3 = 0xa7;
    }
    else {
      cVar1 = bson_iter_next(local_100);
      if (cVar1 == '\0') {
        pcVar4 = "bson_iter_next (&iter)";
        uVar3 = 0xa8;
      }
      else {
        bson_iter_binary(local_100,local_104,&local_108,&local_110);
        if (local_108 == 4) {
          if (*local_110 == 0x34333231) {
            bson_destroy(pbVar2);
            return;
          }
          pcVar4 = "memcmp (binary, \"1234\", 4) == 0";
          uVar3 = 0xab;
        }
        else {
          pcVar4 = "binary_len == 4";
          uVar3 = 0xaa;
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
          uVar3,"test_bson_iter_binary_deprecated",pcVar4);
  abort();
}

Assistant:

static void
test_bson_iter_binary_deprecated (void)
{
   bson_subtype_t subtype;
   uint32_t binary_len;
   const uint8_t *binary;
   bson_iter_t iter;
   bson_t *b;

   b = get_bson (BINARY_DIR "/binary_deprecated.bson");
   BSON_ASSERT (b);

   BSON_ASSERT (bson_iter_init (&iter, b));
   BSON_ASSERT (bson_iter_next (&iter));
   bson_iter_binary (&iter, &subtype, &binary_len, &binary);
   BSON_ASSERT (binary_len == 4);
   BSON_ASSERT (memcmp (binary, "1234", 4) == 0);

   bson_destroy (b);
}